

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

AssertionResult __thiscall
testing::internal::CmpHelperFloatingPointEQ<double>
          (internal *this,char *expected_expression,char *actual_expression,double expected,
          double actual)

{
  double actual_expression_00;
  char *expected_expression_00;
  bool bVar1;
  ostream *poVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  AssertionResult AVar4;
  String local_390;
  String local_380;
  int local_36c;
  stringstream local_368 [8];
  stringstream actual_ss;
  ostream local_358 [396];
  int local_1cc;
  stringstream local_1c8 [8];
  stringstream expected_ss;
  ostream local_1b8 [376];
  FloatingPoint<double> local_40;
  FloatingPoint<double> rhs;
  FloatingPoint<double> lhs;
  double actual_local;
  double expected_local;
  char *actual_expression_local;
  char *expected_expression_local;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar3
  ;
  
  lhs.u_ = (FloatingPointUnion)actual;
  actual_local = expected;
  expected_local = (double)actual_expression;
  actual_expression_local = expected_expression;
  expected_expression_local = (char *)this;
  FloatingPoint<double>::FloatingPoint(&rhs,&actual_local);
  FloatingPoint<double>::FloatingPoint(&local_40,(double *)&lhs);
  bVar1 = FloatingPoint<double>::AlmostEquals(&rhs,&local_40);
  if (bVar1) {
    AVar4 = AssertionSuccess();
    sVar3 = AVar4.message_.ptr_;
  }
  else {
    std::__cxx11::stringstream::stringstream(local_1c8);
    local_1cc = (int)std::setprecision(0x11);
    poVar2 = std::operator<<(local_1b8,(_Setprecision)local_1cc);
    std::ostream::operator<<(poVar2,actual_local);
    std::__cxx11::stringstream::stringstream(local_368);
    local_36c = (int)std::setprecision(0x11);
    poVar2 = std::operator<<(local_358,(_Setprecision)local_36c);
    std::ostream::operator<<(poVar2,(double)lhs.u_);
    expected_expression_00 = actual_expression_local;
    actual_expression_00 = expected_local;
    StringStreamToString((internal *)&local_380,(stringstream *)local_1c8);
    StringStreamToString((internal *)&local_390,(stringstream *)local_368);
    EqFailure(this,expected_expression_00,(char *)actual_expression_00,&local_380,&local_390,false);
    String::~String(&local_390);
    String::~String(&local_380);
    std::__cxx11::stringstream::~stringstream(local_368);
    std::__cxx11::stringstream::~stringstream(local_1c8);
    sVar3.ptr_ = extraout_RDX;
  }
  AVar4.message_.ptr_ = sVar3.ptr_;
  AVar4._0_8_ = this;
  return AVar4;
}

Assistant:

AssertionResult CmpHelperFloatingPointEQ(const char* expected_expression,
                                         const char* actual_expression,
                                         RawType expected,
                                         RawType actual) {
  const FloatingPoint<RawType> lhs(expected), rhs(actual);

  if (lhs.AlmostEquals(rhs)) {
    return AssertionSuccess();
  }

  ::std::stringstream expected_ss;
  expected_ss << std::setprecision(std::numeric_limits<RawType>::digits10 + 2)
              << expected;

  ::std::stringstream actual_ss;
  actual_ss << std::setprecision(std::numeric_limits<RawType>::digits10 + 2)
            << actual;

  return EqFailure(expected_expression,
                   actual_expression,
                   StringStreamToString(&expected_ss),
                   StringStreamToString(&actual_ss),
                   false);
}